

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetItem::setSelected(QTableWidgetItem *this,bool select)

{
  QItemSelectionModel *pQVar1;
  QTableModel *__s;
  long in_RDI;
  long in_FS_OFFSET;
  QTableModel *model;
  QModelIndex index;
  SelectionFlag in_stack_ffffffffffffffac;
  QAbstractItemView *in_stack_ffffffffffffffb0;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  undefined4 local_24;
  undefined1 local_20 [16];
  QTableWidgetItem *local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI + 0x28) != 0) &&
     (pQVar1 = QAbstractItemView::selectionModel(in_stack_ffffffffffffffb0),
     pQVar1 != (QItemSelectionModel *)0x0)) {
    QAbstractItemView::model(in_stack_ffffffffffffffc0);
    __s = qobject_cast<QTableModel_const*>((QObject *)0x8d8534);
    if (__s != (QTableModel *)0x0) {
      local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      QTableModel::index((QTableModel *)local_20,(char *)__s,(int)in_RDI);
      pQVar1 = QAbstractItemView::selectionModel(in_stack_ffffffffffffffb0);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar1,in_stack_ffffffffffffffac);
      (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,local_20,local_24);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetItem::setSelected(bool select)
{
    if (!view || !view->selectionModel())
        return;
    const QTableModel *model = qobject_cast<const QTableModel*>(view->model());
    if (!model)
        return;
    const QModelIndex index = model->index(this);
    view->selectionModel()->select(index, select ? QItemSelectionModel::Select : QItemSelectionModel::Deselect);
}